

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void __thiscall sysapi::epoll_registration::~epoll_registration(epoll_registration *this)

{
  clear(this);
  std::_Function_base::~_Function_base(&(this->callback).super__Function_base);
  return;
}

Assistant:

epoll_registration::~epoll_registration()
{
    clear();
}